

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_StageSetup(ARKodeMem ark_mem)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  realtype *c;
  N_Vector *X;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  
  pvVar3 = ark_mem->step_mem;
  if (pvVar3 == (void *)0x0) {
    iVar5 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","mriStep_StageSetup",
                    "Time step module memory is NULL.");
  }
  else {
    iVar5 = *(int *)((long)pvVar3 + 0x88);
    c = *(realtype **)((long)pvVar3 + 0x198);
    dVar8 = ark_mem->h *
            *(double *)
             (*(long *)((long)pvVar3 + 0x68) +
             (long)*(int *)(*(long *)((long)pvVar3 + 0x50) + (long)iVar5 * 4) * 8);
    X = *(N_Vector **)((long)pvVar3 + 0x1a0);
    *(double *)((long)pvVar3 + 0xa8) = dVar8;
    if (ark_mem->firststage == 0) {
      dVar8 = dVar8 / *(double *)((long)pvVar3 + 0xb0);
    }
    else {
      *(double *)((long)pvVar3 + 0xb0) = dVar8;
      dVar8 = 1.0;
    }
    *(double *)((long)pvVar3 + 0xb8) = dVar8;
    *X = ark_mem->ycur;
    *c = 1.0;
    c[1] = -1.0;
    X[1] = *(N_Vector *)((long)pvVar3 + 0x78);
    if (iVar5 < 1) {
      iVar4 = 2;
    }
    else {
      iVar1 = *(int *)((long)pvVar3 + 0x18);
      iVar2 = *(int *)((long)pvVar3 + 0x1c);
      iVar4 = 2;
      lVar7 = 0;
      do {
        if ((iVar1 != 0) &&
           (lVar6 = (long)*(int *)(*(long *)((long)pvVar3 + 0x50) + lVar7 * 4), -1 < lVar6)) {
          c[iVar4] = ark_mem->h * *(double *)(*(long *)((long)pvVar3 + 0x60) + lVar6 * 8);
          X[iVar4] = *(N_Vector *)(*(long *)((long)pvVar3 + 0x28) + lVar6 * 8);
          iVar4 = iVar4 + 1;
        }
        if ((iVar2 != 0) &&
           (lVar6 = (long)*(int *)(*(long *)((long)pvVar3 + 0x50) + lVar7 * 4), -1 < lVar6)) {
          c[iVar4] = ark_mem->h * *(double *)(*(long *)((long)pvVar3 + 0x68) + lVar6 * 8);
          X[iVar4] = *(N_Vector *)(*(long *)((long)pvVar3 + 0x30) + lVar6 * 8);
          iVar4 = iVar4 + 1;
        }
        lVar7 = lVar7 + 1;
      } while (iVar5 != lVar7);
    }
    iVar4 = N_VLinearCombination(iVar4,c,X,*(N_Vector *)((long)pvVar3 + 0x70));
    iVar5 = -0x1c;
    if (iVar4 == 0) {
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int mriStep_StageSetup(ARKodeMem ark_mem)
{
  /* local data */
  ARKodeMRIStepMem step_mem;
  int retval, i, j, nvec;
  realtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "mriStep_StageSetup", MSG_MRISTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem) ark_mem->step_mem;

  /* Set shortcut to current stage index */
  i = step_mem->istage;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* Update gamma (if the method contains an implicit component) */
  step_mem->gamma = ark_mem->h * step_mem->Ai_row[step_mem->stage_map[i]];

  if (ark_mem->firststage)
    step_mem->gammap = step_mem->gamma;
  step_mem->gamrat = (ark_mem->firststage) ?
    ONE : step_mem->gamma / step_mem->gammap;  /* protect x/x != 1.0 */

  /* set cvals and Xvecs for setting stage data */
  cvals[0] = ONE;
  Xvecs[0] = ark_mem->ycur;
  cvals[1] = -ONE;
  Xvecs[1] = step_mem->zpred;
  nvec     = 2;

  for (j = 0; j < i; j++) {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1) {
      cvals[nvec] = ark_mem->h * step_mem->Ae_row[step_mem->stage_map[j]];
      Xvecs[nvec] = step_mem->Fse[step_mem->stage_map[j]];
      nvec += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1) {
      cvals[nvec] = ark_mem->h * step_mem->Ai_row[step_mem->stage_map[j]];
      Xvecs[nvec] = step_mem->Fsi[step_mem->stage_map[j]];
      nvec += 1;
    }
  }

  /* call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, step_mem->sdata);
  if (retval != 0) return(ARK_VECTOROP_ERR);

  /* return with success */
  return (ARK_SUCCESS);
}